

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O2

void __thiscall
helics::PublicationInfo::disconnectFederate(PublicationInfo *this,GlobalFederateId fedToDisconnect)

{
  long lVar1;
  long lVar2;
  SubscriberInformation *pSVar3;
  const_iterator __first;
  const_iterator __last;
  
  pSVar3 = (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->subscribers).
       super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  lVar2 = (long)__last._M_current - (long)pSVar3;
  for (lVar1 = lVar2 / 0x28 >> 2; 0 < lVar1; lVar1 = lVar1 + -1) {
    __first._M_current = pSVar3;
    if ((pSVar3->id).fed_id.gid == fedToDisconnect.gid) goto LAB_00278604;
    if (pSVar3[1].id.fed_id.gid == fedToDisconnect.gid) {
      __first._M_current = pSVar3 + 1;
      goto LAB_00278604;
    }
    if (pSVar3[2].id.fed_id.gid == fedToDisconnect.gid) {
      __first._M_current = pSVar3 + 2;
      goto LAB_00278604;
    }
    if (pSVar3[3].id.fed_id.gid == fedToDisconnect.gid) {
      __first._M_current = pSVar3 + 3;
      goto LAB_00278604;
    }
    pSVar3 = pSVar3 + 4;
    lVar2 = lVar2 + -0xa0;
  }
  lVar2 = lVar2 / 0x28;
  if (lVar2 == 1) {
LAB_002785ec:
    __first._M_current = pSVar3;
    if ((pSVar3->id).fed_id.gid != fedToDisconnect.gid) {
      __first._M_current = __last._M_current;
    }
  }
  else if (lVar2 == 2) {
LAB_002785e4:
    __first._M_current = pSVar3;
    if ((pSVar3->id).fed_id.gid != fedToDisconnect.gid) {
      pSVar3 = pSVar3 + 1;
      goto LAB_002785ec;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (lVar2 != 3) goto LAB_00278641;
    __first._M_current = pSVar3;
    if ((pSVar3->id).fed_id.gid != fedToDisconnect.gid) {
      pSVar3 = pSVar3 + 1;
      goto LAB_002785e4;
    }
  }
LAB_00278604:
  pSVar3 = __first._M_current;
  if (__first._M_current != __last._M_current) {
    while (__first._M_current = __first._M_current + 1, __first._M_current != __last._M_current) {
      if (((__first._M_current)->id).fed_id.gid != fedToDisconnect.gid) {
        SubscriberInformation::operator=(pSVar3,__first._M_current);
        pSVar3 = pSVar3 + 1;
      }
    }
    __last._M_current =
         (this->subscribers).
         super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    __first._M_current = pSVar3;
  }
LAB_00278641:
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::erase
            (&this->subscribers,__first,__last);
  return;
}

Assistant:

void PublicationInfo::disconnectFederate(GlobalFederateId fedToDisconnect)
{
    subscribers.erase(std::remove_if(subscribers.begin(),
                                     subscribers.end(),
                                     [fedToDisconnect](const auto& val) {
                                         return val.id.fed_id == fedToDisconnect;
                                     }),
                      subscribers.end());
}